

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

int mpc_test_fail(mpc_parser_t *p,char *s,void *d,_func_int_void_ptr_void_ptr *tester,
                 mpc_dtor_t destructor,_func_void_void_ptr *printer)

{
  int iVar1;
  uint uVar2;
  mpc_result_t r;
  
  iVar1 = mpc_parse("<test>",s,p,&r);
  if (iVar1 == 0) {
    mpc_err_delete(r.error);
    uVar2 = 1;
  }
  else {
    iVar1 = (*tester)(r.error,d);
    uVar2 = (uint)(iVar1 == 0);
    (*destructor)(r.error);
  }
  return uVar2;
}

Assistant:

int mpc_test_fail(mpc_parser_t *p, const char *s, const void *d,
  int(*tester)(const void*, const void*),
  mpc_dtor_t destructor,
  void(*printer)(const void*)) {
  mpc_result_t r;
  (void) printer;
  if (mpc_parse("<test>", s, p, &r)) {

    if (tester(r.output, d)) {
      destructor(r.output);
      return 0;
    } else {
      destructor(r.output);
      return 1;
    }

  } else {
    mpc_err_delete(r.error);
    return 1;
  }

}